

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerCoreInlines.h
# Opt level: O0

void __thiscall PowerCore::record(PowerCore *this,int field,int32_t val)

{
  int32_t val_local;
  int field_local;
  PowerCore *this_local;
  
  if (val < 0) {
    setcr(this,field,(this->super_PowerCoreState).SO & 1 | 8);
  }
  else if (val < 1) {
    setcr(this,field,(this->super_PowerCoreState).SO & 1 | 2);
  }
  else {
    setcr(this,field,(this->super_PowerCoreState).SO & 1 | 4);
  }
  return;
}

Assistant:

inline void PowerCore::record(int field, int32_t val)
{
    if(val < 0)
        setcr(field, 8 | SO);
    else if(val > 0)
        setcr(field, 4 | SO);
    else
        setcr(field, 2 | SO);
}